

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O1

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          *heapBucket)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  uint uVar2;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    uVar2 = HeapInfo::GetMediumBucketIndex((ulong)(heapBucket->super_HeapBucket).sizeCat);
    pSVar3 = (this->mediumFinalizableWithBarrierData).bucketData[uVar2].pendingSweepList;
    lVar6 = 0;
    while (pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
    {
      pSVar1 = (pSVar3->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
      }
      lVar6 = lVar6 + 1;
    }
    pSVar3 = (this->mediumFinalizableWithBarrierData).bucketData[uVar2].pendingEmptyBlockList;
    lVar4 = 0;
    while (pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
    {
      pSVar1 = (pSVar3->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
      }
      lVar4 = lVar4 + 1;
    }
    sVar5 = lVar4 + lVar6;
  }
  else {
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}